

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

iterator __thiscall
phmap::priv::anon_unknown_0::
multi_checker<phmap::btree_multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::insert(multi_checker<phmap::btree_multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *this,value_type *x)

{
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar1;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *extraout_RAX;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *extraout_RAX_00;
  long lVar2;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  char *pcVar3;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar4;
  iterator iVar5;
  iterator iVar6;
  _Alloc_node __an;
  AssertHelper local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  _Alloc_node local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  
  sVar1 = (this->
          super_base_checker<phmap::btree_multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ).tree_.
          super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
          .tree_.size_;
  this_00 = &(this->
             super_base_checker<phmap::btree_multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ).checker_;
  pVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_get_insert_equal_pos(&this_00->_M_t,x);
  local_30._M_t = &this_00->_M_t;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::
  _M_insert_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,pVar4.first,pVar4.second,x,&local_30);
  iVar5 = btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
          ::insert_multi<std::__cxx11::string_const&>
                    ((btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
                      *)this,x,x);
  if (((undefined1  [16])iVar5 & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    lVar2 = (long)iVar5.position * 0x20;
    (anonymous_namespace)::CheckPairEquals<std::__cxx11::string,std::__cxx11::string>
              (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (iVar5.node + lVar2 + 0x10),
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (iVar5.node + lVar2 + 0x18));
    local_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (this->
         super_base_checker<phmap::btree_multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).tree_.
         super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
         .
         super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
         .tree_.size_;
    local_40.data_ =
         (AssertHelperData *)
         (this->
         super_base_checker<phmap::btree_multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).checker_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_30,"this->tree_.size()","this->checker_.size()",
               (unsigned_long *)&local_38,(unsigned_long *)&local_40);
    if (local_30._M_t._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_28->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,399,pcVar3);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_28,local_28);
    }
    local_38._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (this->
         super_base_checker<phmap::btree_multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).tree_.
         super_btree_multiset_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
         .
         super_btree_container<phmap::priv::btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_>
         .tree_.size_;
    local_40.data_ = (AssertHelperData *)(sVar1 + 1);
    iVar6 = (iterator)
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)&local_30,"this->tree_.size()","size + 1",
                       (unsigned_long *)&local_38,(unsigned_long *)&local_40);
    if (local_30._M_t._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_28->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,400,pcVar3);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      iVar6._8_8_ = extraout_RDX._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
      iVar6.node = extraout_RAX;
      if (local_38._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        iVar6 = (iterator)(**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
    if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_28,local_28);
      iVar6._8_8_ = extraout_RDX_00._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
      iVar6.node = extraout_RAX_00;
    }
    return iVar6;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, true>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, true>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::Less<std::basic_string<char>>, std::allocator<std::basic_string<char>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
               );
}

Assistant:

iterator insert(const value_type &x) {
            size_t size = this->tree_.size();
            auto checker_res = this->checker_.insert(x);
            iterator tree_res = this->tree_.insert(x);
            CheckPairEquals(*tree_res, *checker_res);
            EXPECT_EQ(this->tree_.size(), this->checker_.size());
            EXPECT_EQ(this->tree_.size(), size + 1);
            return tree_res;
        }